

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O1

Am_Object move_grow_set_impl_command
                    (Am_Object *inter,Am_Object *object_modified,Am_Inter_Location *data)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Inter_Location *in_RCX;
  Am_Inter_Location orig_data;
  Am_Object AStack_58;
  Am_Inter_Location local_50;
  Am_Object local_48;
  Am_Inter_Location local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  inter->data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&AStack_58,(Am_Slot_Key)object_modified,0xc6);
  Am_Object::operator=(inter,&AStack_58);
  Am_Object::~Am_Object(&AStack_58);
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)data);
    Am_Object::Set(inter,0x16d,value,0);
    pAVar2 = Am_Object::Get(object_modified,0xda,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    Am_Object::Set(inter,0xda,bVar1,0);
    Am_Object::Get_Object(&local_30,(Am_Slot_Key)data,10);
    bVar1 = Am_Inter_Location::Translate_To(in_RCX,&local_30);
    Am_Object::~Am_Object(&local_30);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Can\'t translate data to owner of ",0x21);
      poVar3 = operator<<((ostream *)&std::cerr,(Am_Object *)data);
      std::endl<char,std::char_traits<char>>(poVar3);
      Am_Error();
    }
    Am_Object::Am_Object(&local_38,inter);
    Am_Inter_Location::Am_Inter_Location(&local_40,in_RCX);
    Am_Copy_Data_Into_Slot(&local_38,0x169,&local_40);
    Am_Inter_Location::~Am_Inter_Location(&local_40);
    Am_Object::~Am_Object(&local_38);
    Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&AStack_58);
    pAVar2 = Am_Object::Get(object_modified,0x16c,0);
    Am_Inter_Location::operator=((Am_Inter_Location *)&AStack_58,pAVar2);
    Am_Object::Am_Object(&local_48,inter);
    Am_Inter_Location::Am_Inter_Location(&local_50,(Am_Inter_Location *)&AStack_58);
    Am_Copy_Data_Into_Slot(&local_48,0x16c,&local_50);
    Am_Inter_Location::~Am_Inter_Location(&local_50);
    Am_Object::~Am_Object(&local_48);
    Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&AStack_58);
  }
  return (Am_Object)(Am_Object_Data *)inter;
}

Assistant:

Am_Object
move_grow_set_impl_command(Am_Object inter, Am_Object object_modified,
                           Am_Inter_Location data)
{
  Am_Object impl_command;
  impl_command = inter.Get_Object(Am_IMPLEMENTATION_COMMAND);
  if (impl_command.Valid()) {
    impl_command.Set(Am_OBJECT_MODIFIED, object_modified);
    impl_command.Set(Am_GROWING, (bool)inter.Get(Am_GROWING));

    //adjust the data so it has the right owner
    if (!data.Translate_To(object_modified.Get_Owner()))
      Am_ERROR("Can't translate data to owner of " << object_modified);
    //set current value into the Am_VALUE slot
    Am_Copy_Data_Into_Slot(impl_command, Am_VALUE, data);

    //set original data into the OLD_VALUE slot
    Am_Inter_Location orig_data;
    orig_data = inter.Get(Am_OLD_VALUE);
    Am_Copy_Data_Into_Slot(impl_command, Am_OLD_VALUE, orig_data);
  }
  return impl_command;
}